

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O0

void __thiscall KDReports::ImageElement::setPixmap(ImageElement *this,QPixmap *pixmap)

{
  pointer pIVar1;
  QSize QVar2;
  QImage local_50 [24];
  enable_if_t<std::is_copy_constructible_v<QImage>,_QVariant> local_38;
  QPixmap *local_18;
  QPixmap *pixmap_local;
  ImageElement *this_local;
  
  local_18 = pixmap;
  pixmap_local = (QPixmap *)this;
  QPixmap::toImage();
  QVariant::fromValue<QImage>(&local_38,local_50);
  pIVar1 = std::
           unique_ptr<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
           ::operator->(&this->d);
  QVariant::operator=(&pIVar1->m_pixmap,&local_38);
  QVariant::~QVariant(&local_38);
  QImage::~QImage(local_50);
  QVar2 = (QSize)QPixmap::size();
  pIVar1 = std::
           unique_ptr<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
           ::operator->(&this->d);
  pIVar1->m_pixmapSize = QVar2;
  return;
}

Assistant:

void KDReports::ImageElement::setPixmap(const QPixmap &pixmap)
{
    // the call to toImage() is a workaround for a bug in QTextOdfWriter
    // https://codereview.qt-project.org/c/qt/qtbase/+/369642
    d->m_pixmap = QVariant::fromValue(pixmap.toImage());
    d->m_pixmapSize = pixmap.size();
}